

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PulseStyleSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PulseStyleSymbol,slang::SourceLocation,slang::ast::PulseStyleKind&>
          (BumpAllocator *this,SourceLocation *args,PulseStyleKind *args_1)

{
  PulseStyleKind PVar1;
  SourceLocation SVar2;
  PulseStyleSymbol *pPVar3;
  
  pPVar3 = (PulseStyleSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PulseStyleSymbol *)this->endPtr < pPVar3 + 1) {
    pPVar3 = (PulseStyleSymbol *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pPVar3 + 1);
  }
  SVar2 = *args;
  PVar1 = *args_1;
  (pPVar3->super_Symbol).kind = PulseStyle;
  (pPVar3->super_Symbol).name._M_len = 0;
  (pPVar3->super_Symbol).name._M_str = "";
  (pPVar3->super_Symbol).location = SVar2;
  (pPVar3->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pPVar3->super_Symbol).parentScope = (Scope *)0x0;
  (pPVar3->super_Symbol).nextInScope = (Symbol *)0x0;
  (pPVar3->super_Symbol).indexInScope = 0;
  pPVar3->pulseStyleKind = PVar1;
  pPVar3->isResolved = false;
  (pPVar3->terminals)._M_ptr = (pointer)0x0;
  (pPVar3->terminals)._M_extent._M_extent_value = 0;
  return pPVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }